

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O1

bool __thiscall DTextEnterMenu::MenuEvent(DTextEnterMenu *this,int key,bool fromcontroller)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  DMenu *pDVar6;
  
  if (key == 7) {
    pDVar6 = (this->super_DMenu).mParentMenu.field_0.p;
    (*(pDVar6->super_DObject)._vptr_DObject[8])(pDVar6,0xb,0);
    bVar2 = DMenu::MenuEvent(&this->super_DMenu,7,fromcontroller);
    return bVar2;
  }
  if (fromcontroller) {
    this->mInputGridOkay = true;
  }
  if (this->mInputGridOkay != true) {
    return false;
  }
  if ((this->InputGridX == -1) || (this->InputGridY == -1)) {
    this->InputGridX = 0;
    this->InputGridY = 0;
  }
  bVar2 = false;
  switch(key) {
  case 0:
    iVar4 = this->InputGridY + ((this->InputGridY + 4) / 5) * -5 + 4;
    break;
  case 1:
    iVar4 = this->InputGridY + ((this->InputGridY + 1) / 5) * -5 + 1;
    break;
  case 2:
    iVar4 = this->InputGridX + ((this->InputGridX + 0xc) / 0xd) * -0xd + 0xc;
    goto LAB_00311921;
  case 3:
    iVar4 = this->InputGridX + ((this->InputGridX + 1) / 0xd) * -0xd + 1;
LAB_00311921:
    this->InputGridX = iVar4;
    goto LAB_00311924;
  default:
    goto switchD_003117d2_caseD_4;
  case 6:
    if ((0xc < (ulong)(uint)this->InputGridX) || (4 < (ulong)(uint)this->InputGridY)) {
      __assert_fail("unsigned(InputGridX) < INPUTGRID_WIDTH && unsigned(InputGridY) < INPUTGRID_HEIGHT"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/menu/menuinput.cpp"
                    ,0xff,"virtual bool DTextEnterMenu::MenuEvent(int, bool)");
    }
    lVar5 = (ulong)(uint)this->InputGridY * 0xd + (ulong)(uint)this->InputGridX;
    if ((char)lVar5 != '?') {
      if (((uint)lVar5 & 0xff) == 0x40) {
        if (*this->mEnterString == '\0') {
          return true;
        }
        pDVar6 = (this->super_DMenu).mParentMenu.field_0.p;
        if ((pDVar6 != (DMenu *)0x0) && (((pDVar6->super_DObject).ObjectFlags & 0x20) != 0)) {
          (this->super_DMenu).mParentMenu.field_0.p = (DMenu *)0x0;
          pDVar6 = (DMenu *)0x0;
        }
        (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
        (*(pDVar6->super_DObject)._vptr_DObject[8])(pDVar6,10,0);
        return true;
      }
      if (this->mEnterSize <= this->mEnterPos) {
        return true;
      }
      cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789+-=.,!?@\'\":;[]()<>^#$%&*/_ \b"[lVar5];
      if ((this->mSizeMode != 2) &&
         (iVar4 = FFont::StringWidth(SmallFont,(BYTE *)this->mEnterString),
         (ulong)(this->mEnterSize * 8 - 8) <= (ulong)(long)iVar4)) {
        return true;
      }
      this->mEnterString[this->mEnterPos] = cVar1;
      uVar3 = this->mEnterPos + 1;
      this->mEnterPos = uVar3;
      this->mEnterString[uVar3] = '\0';
      return true;
    }
  case 8:
    bVar2 = true;
    if (this->mEnterPos != 0) {
      uVar3 = this->mEnterPos - 1;
      this->mEnterPos = uVar3;
      this->mEnterString[uVar3] = '\0';
    }
    goto switchD_003117d2_caseD_4;
  }
  this->InputGridY = iVar4;
LAB_00311924:
  bVar2 = true;
switchD_003117d2_caseD_4:
  return bVar2;
}

Assistant:

bool DTextEnterMenu::MenuEvent (int key, bool fromcontroller)
{
	if (key == MKEY_Back)
	{
		mParentMenu->MenuEvent(MKEY_Abort, false);
		return Super::MenuEvent(key, fromcontroller);
	}
	if (fromcontroller)
	{
		mInputGridOkay = true;
	}

	if (mInputGridOkay)
	{
		int ch;

		if (InputGridX == -1 || InputGridY == -1)
		{
			InputGridX = InputGridY = 0;
		}
		switch (key)
		{
		case MKEY_Down:
			InputGridY = (InputGridY + 1) % INPUTGRID_HEIGHT;
			return true;

		case MKEY_Up:
			InputGridY = (InputGridY + INPUTGRID_HEIGHT - 1) % INPUTGRID_HEIGHT;
			return true;

		case MKEY_Right:
			InputGridX = (InputGridX + 1) % INPUTGRID_WIDTH;
			return true;

		case MKEY_Left:
			InputGridX = (InputGridX + INPUTGRID_WIDTH - 1) % INPUTGRID_WIDTH;
			return true;

		case MKEY_Clear:
			if (mEnterPos > 0)
			{
				mEnterString[--mEnterPos] = 0;
			}
			return true;

		case MKEY_Enter:
			assert(unsigned(InputGridX) < INPUTGRID_WIDTH && unsigned(InputGridY) < INPUTGRID_HEIGHT);
			if (mInputGridOkay)
			{
				ch = InputGridChars[InputGridX + InputGridY * INPUTGRID_WIDTH];
				if (ch == 0)			// end
				{
					if (mEnterString[0] != '\0')
					{
						DMenu *parent = mParentMenu;
						Close();
						parent->MenuEvent(MKEY_Input, false);
						return true;
					}
				}
				else if (ch == '\b')	// bs
				{
					if (mEnterPos > 0)
					{
						mEnterString[--mEnterPos] = 0;
					}
				}
				else if (mEnterPos < mEnterSize &&
					(mSizeMode == 2/*entering player name*/ || (size_t)SmallFont->StringWidth(mEnterString) < (mEnterSize-1)*8))
				{
					mEnterString[mEnterPos] = ch;
					mEnterString[++mEnterPos] = 0;
				}
			}
			return true;

		default:
			break;	// Keep GCC quiet
		}
	}
	return false;
}